

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute.cpp
# Opt level: O1

void __thiscall
glslang::TParseContext::handleSelectionAttributes
          (TParseContext *this,TAttributes *attributes,TIntermNode *node)

{
  _List_node_base *p_Var1;
  int iVar2;
  undefined4 extraout_var;
  long lVar4;
  undefined8 uVar5;
  undefined4 extraout_var_01;
  char *pcVar6;
  _func_int **pp_Var7;
  long lVar3;
  undefined4 extraout_var_00;
  
  iVar2 = (*node->_vptr_TIntermNode[9])(node);
  lVar3 = CONCAT44(extraout_var,iVar2);
  if (lVar3 != 0) {
    for (p_Var1 = (attributes->
                  super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>
                  ).
                  super__List_base<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>
                  ._M_impl._M_node.super__List_node_base._M_next;
        (_List_node_header *)p_Var1 !=
        &(attributes->
         super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>).
         super__List_base<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>
         ._M_impl._M_node; p_Var1 = p_Var1->_M_next) {
      if ((p_Var1[1]._M_prev == (_List_node_base *)0x0) ||
         (lVar4 = (*(code *)(p_Var1[1]._M_prev)->_M_next[0x19]._M_prev)(),
         (int)((ulong)(*(long *)(lVar4 + 0x10) - *(long *)(lVar4 + 8)) >> 3) < 1)) {
        if (*(int *)&p_Var1[1]._M_next == 2) {
          *(undefined1 *)(lVar3 + 0xd2) = 1;
        }
        else {
          if (*(int *)&p_Var1[1]._M_next != 7) {
            iVar2 = (**node->_vptr_TIntermNode)(node);
            uVar5 = CONCAT44(extraout_var_01,iVar2);
            pp_Var7 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
            pcVar6 = "attribute does not apply to a selection";
            goto LAB_004711a9;
          }
          *(undefined1 *)(lVar3 + 0xd1) = 1;
        }
      }
      else {
        iVar2 = (**node->_vptr_TIntermNode)(node);
        uVar5 = CONCAT44(extraout_var_00,iVar2);
        pp_Var7 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
        pcVar6 = "attribute with arguments not recognized, skipping";
LAB_004711a9:
        (*pp_Var7[0x2e])(this,uVar5,pcVar6,"","");
      }
    }
  }
  return;
}

Assistant:

void TParseContext::handleSelectionAttributes(const TAttributes& attributes, TIntermNode* node)
{
    TIntermSelection* selection = node->getAsSelectionNode();
    if (selection == nullptr)
        return;

    for (auto it = attributes.begin(); it != attributes.end(); ++it) {
        if (it->size() > 0) {
            warn(node->getLoc(), "attribute with arguments not recognized, skipping", "", "");
            continue;
        }

        switch (it->name) {
        case EatFlatten:
            selection->setFlatten();
            break;
        case EatBranch:
            selection->setDontFlatten();
            break;
        default:
            warn(node->getLoc(), "attribute does not apply to a selection", "", "");
            break;
        }
    }
}